

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOperatorTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Performance::anon_unknown_1::OperatorPerformanceCase::prepareNextRound
          (OperatorPerformanceCase *this)

{
  vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
  *this_00;
  int iVar1;
  TestLog *pTVar2;
  pointer pvVar3;
  State SVar4;
  State SVar5;
  long lVar6;
  pointer pWVar7;
  MessageBuilder *pMVar8;
  InternalError *this_01;
  int iVar9;
  int iVar10;
  int iVar11;
  pointer pWVar12;
  float fVar13;
  float fVar14;
  undefined1 local_1b0 [8];
  _Vector_base<float,_std::allocator<float>_> local_1a8 [15];
  
  do {
    pTVar2 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    SVar5 = this->m_state;
    if (SVar5 == STATE_CALIBRATING) {
      SVar4 = deqp::gls::TheilSenCalibrator::getState(&this->m_calibrator);
      if (SVar4 != STATE_FINISHED) {
        SVar5 = this->m_state;
        goto LAB_00f30052;
      }
      this->m_state = STATE_FIND_HIGH_WORKLOAD;
      this->m_measureProgramNdx = 0;
      lVar6 = 0;
LAB_00f300b8:
      pvVar3 = (this->m_workloadRecordsFindHigh).
               super__Vector_base<std::vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      this_00 = pvVar3 + lVar6;
      pWVar7 = pvVar3[lVar6].
               super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pWVar12 = *(pointer *)
                 ((long)&pvVar3[lVar6].
                         super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                         ._M_impl.super__Vector_impl_data + 8);
      if (pWVar7 == pWVar12) goto LAB_00f30163;
      fVar13 = WorkloadRecord::getMedianTime(pWVar12 + -1);
      fVar14 = WorkloadRecord::getMedianTime
                         ((this_00->
                          super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                          )._M_impl.super__Vector_impl_data._M_start);
      if (fVar13 < fVar14 + fVar14) {
        pWVar7 = (this_00->
                 super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pWVar12 = (this_00->
                  super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
LAB_00f30163:
        if (pWVar7 == pWVar12) {
          iVar10 = 1;
        }
        else {
          iVar10 = pWVar12[-1].workloadSize * 2;
          if (0x20000000 < iVar10) {
            local_1b0 = (undefined1  [8])pTVar2;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::operator<<((ostream *)local_1a8,"Even workload size ");
            pMVar8 = tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)local_1b0,
                                &(this_00->
                                 super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
                                 )._M_impl.super__Vector_impl_data._M_finish[-1].workloadSize);
            std::operator<<(&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                            " doesn\'t give high enough frame time for program ");
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&this->m_measureProgramNdx);
            std::operator<<(&(pMVar8->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                            ". Can\'t get sensible result.");
            tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            this_01 = (InternalError *)__cxa_allocate_exception(0x38);
            tcu::InternalError::InternalError
                      (this_01,"Unable to get sensible measurements for estimation",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pShaderOperatorTests.cpp"
                       ,0x2ce);
            __cxa_throw(this_01,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
          }
        }
        local_1b0._0_4_ = iVar10;
        local_1a8[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1a8[0]._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1a8[0]._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
        ::push_back(this_00,(value_type *)local_1b0);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(local_1a8);
        prepareWorkload(this,0,iVar10);
        this->m_workloadMeasurementNdx = 0;
        return;
      }
      (this->m_highWorkloadSizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[this->m_measureProgramNdx] =
           (this_00->
           super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
           )._M_impl.super__Vector_impl_data._M_finish[-1].workloadSize;
      iVar11 = this->m_measureProgramNdx + 1;
      this->m_measureProgramNdx = iVar11;
      if ((int)((ulong)((long)(this->m_programs).
                              super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_programs).
                             super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) <= iVar11) {
        this->m_state = STATE_MEASURING;
        this->m_measureProgramNdx = 0;
        this->m_workloadNdx = -1;
        iVar11 = 0;
      }
    }
    else {
LAB_00f30052:
      if (SVar5 == STATE_FIND_HIGH_WORKLOAD) {
        lVar6 = (long)this->m_measureProgramNdx;
        goto LAB_00f300b8;
      }
      if (SVar5 == STATE_CALIBRATING) {
        prepareWorkload(this,0,1);
        return;
      }
      iVar10 = this->m_numWorkloads;
      iVar9 = this->m_workloadNdx + 1;
      this->m_workloadNdx = iVar9;
      iVar11 = this->m_measureProgramNdx;
      if (iVar9 < iVar10) {
        iVar1 = (this->m_highWorkloadSizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar11];
        if (iVar10 < iVar1) {
          iVar9 = ((iVar1 + -1) * iVar9) / (iVar10 + -1);
        }
        prepareWorkload(this,iVar11,iVar9 + 1);
        this->m_workloadMeasurementNdx = 0;
        local_1b0._0_4_ = iVar9 + 1;
        local_1a8[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1a8[0]._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1a8[0]._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>
        ::push_back((this->m_workloadRecords).
                    super__Vector_base<std::vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>,_std::allocator<std::vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::WorkloadRecord>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + this->m_measureProgramNdx,
                    (value_type *)local_1b0);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(local_1a8);
        return;
      }
      iVar11 = iVar11 + 1;
      this->m_measureProgramNdx = iVar11;
      if ((int)((ulong)((long)(this->m_programs).
                              super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_programs).
                             super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) <= iVar11) {
        this->m_state = STATE_REPORTING;
        return;
      }
      this->m_workloadNdx = -1;
      this->m_workloadMeasurementNdx = 0;
    }
    prepareProgram(this,iVar11);
  } while( true );
}

Assistant:

void OperatorPerformanceCase::prepareNextRound (void)
{
	DE_ASSERT(m_state == STATE_CALIBRATING			||
			  m_state == STATE_FIND_HIGH_WORKLOAD	||
			  m_state == STATE_MEASURING);

	TestLog& log = m_testCtx.getLog();

	if (m_state == STATE_CALIBRATING && m_calibrator.getState() == TheilSenCalibrator::STATE_FINISHED)
	{
		m_measureProgramNdx = 0;
		m_state = STATE_FIND_HIGH_WORKLOAD;
	}

	if (m_state == STATE_CALIBRATING)
		prepareWorkload(0, 1);
	else if (m_state == STATE_FIND_HIGH_WORKLOAD)
	{
		vector<WorkloadRecord>& records = m_workloadRecordsFindHigh[m_measureProgramNdx];

		if (records.empty() || records.back().getMedianTime() < 2.0f*records[0].getMedianTime())
		{
			int workloadSize;

			if (records.empty())
				workloadSize = 1;
			else
			{
				workloadSize = records.back().workloadSize*2;

				if (workloadSize > MAX_WORKLOAD_SIZE)
				{
					log << TestLog::Message << "Even workload size " << records.back().workloadSize
											<< " doesn't give high enough frame time for program " << m_measureProgramNdx
											<< ". Can't get sensible result." << TestLog::EndMessage;
					MEASUREMENT_FAIL();
				}
			}

			records.push_back(WorkloadRecord(workloadSize));
			prepareWorkload(0, workloadSize);
			m_workloadMeasurementNdx = 0;
		}
		else
		{
			m_highWorkloadSizes[m_measureProgramNdx] = records.back().workloadSize;
			m_measureProgramNdx++;

			if (m_measureProgramNdx >= (int)m_programs.size())
			{
				m_state = STATE_MEASURING;
				m_workloadNdx = -1;
				m_measureProgramNdx = 0;
			}

			prepareProgram(m_measureProgramNdx);
			prepareNextRound();
		}
	}
	else
	{
		m_workloadNdx++;

		if (m_workloadNdx < m_numWorkloads)
		{
			DE_ASSERT(m_numWorkloads > 1);
			const int highWorkload	= m_highWorkloadSizes[m_measureProgramNdx];
			const int workload		= highWorkload > m_numWorkloads ?
										1 + m_workloadNdx*(highWorkload-1)/(m_numWorkloads-1) :
										1 + m_workloadNdx;

			prepareWorkload(m_measureProgramNdx, workload);

			m_workloadMeasurementNdx = 0;

			m_workloadRecords[m_measureProgramNdx].push_back(WorkloadRecord(workload));
		}
		else
		{
			m_measureProgramNdx++;

			if (m_measureProgramNdx < (int)m_programs.size())
			{
				m_workloadNdx = -1;
				m_workloadMeasurementNdx = 0;
				prepareProgram(m_measureProgramNdx);
				prepareNextRound();
			}
			else
				m_state = STATE_REPORTING;
		}
	}
}